

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames.cpp
# Opt level: O0

UBool __thiscall
icu_63::TimeZoneNamesDelegate::operator==(TimeZoneNamesDelegate *this,TimeZoneNames *other)

{
  long local_40;
  TimeZoneNamesDelegate *rhs;
  TimeZoneNames *other_local;
  TimeZoneNamesDelegate *this_local;
  
  if (this == (TimeZoneNamesDelegate *)other) {
    this_local._7_1_ = true;
  }
  else {
    if (other == (TimeZoneNames *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = __dynamic_cast(other,&TimeZoneNames::typeinfo,&typeinfo,0);
    }
    if (local_40 == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = this->fTZnamesCacheEntry == *(TimeZoneNamesCacheEntry **)(local_40 + 8);
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
TimeZoneNamesDelegate::operator==(const TimeZoneNames& other) const {
    if (this == &other) {
        return TRUE;
    }
    // Just compare if the other object also use the same
    // cache entry
    const TimeZoneNamesDelegate* rhs = dynamic_cast<const TimeZoneNamesDelegate*>(&other);
    if (rhs) {
        return fTZnamesCacheEntry == rhs->fTZnamesCacheEntry;
    }
    return FALSE;
}